

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

reference __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>_>_>
::iterator::operator*(iterator *this)

{
  ctrl_t *pcVar1;
  code *pcVar2;
  Descriptor *pDVar3;
  Descriptor *pDVar4;
  Descriptor *pDVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  undefined1 auVar9 [16];
  ctrl_t cVar10;
  ctrl_t cVar11;
  ctrl_t cVar12;
  ctrl_t cVar13;
  ctrl_t cVar14;
  ctrl_t cVar15;
  ctrl_t cVar16;
  ctrl_t cVar17;
  ctrl_t cVar18;
  ctrl_t cVar19;
  ctrl_t cVar20;
  ctrl_t cVar21;
  ctrl_t cVar22;
  ctrl_t cVar23;
  ctrl_t cVar24;
  ctrl_t cVar25;
  Descriptor *pDVar26;
  Descriptor *pDVar27;
  ushort uVar28;
  ctrl_t *pcVar29;
  slot_type *psVar30;
  reference ppVar31;
  bool bVar32;
  Descriptor *pDVar33;
  ulong uVar34;
  Descriptor **in_RSI;
  uint uVar35;
  undefined1 uVar36;
  ulong uVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  iterator iVar41;
  ulong uStack_a0;
  reference ppStack_80;
  anon_union_8_1_a8a14541_for_iterator_2 aStack_70;
  ctrl_t cStack_68;
  ctrl_t cStack_67;
  ctrl_t cStack_66;
  ctrl_t cStack_65;
  
  pcVar2 = (code *)this->ctrl_;
  if (pcVar2 == (code *)0x0) {
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,absl::lts_20240722::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>>>
    ::iterator::operator*((iterator *)this);
LAB_002f2e63:
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,absl::lts_20240722::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>>>
    ::iterator::operator*((iterator *)this);
  }
  else {
    if (pcVar2 == absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>)
    goto LAB_002f2e63;
    if (-1 < (char)*pcVar2) {
      return (reference)(this->field_1).slot_;
    }
  }
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,absl::lts_20240722::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>>>
  ::iterator::operator*((iterator *)this);
  pDVar3 = *(Descriptor **)this;
  if ((pDVar3 == (Descriptor *)
                 absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double> ||
       pDVar3 == (Descriptor *)0x0) || (-1 < (char)(pDVar3->super_SymbolBase).symbol_type_)) {
    pDVar4 = *in_RSI;
    if ((pDVar4 != (Descriptor *)
                   absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double> &&
         pDVar4 != (Descriptor *)0x0) && ((char)(pDVar4->super_SymbolBase).symbol_type_ < '\0'))
    goto LAB_002f2f5c;
    if (pDVar3 == (Descriptor *)
                  absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double> &&
        pDVar4 == (Descriptor *)
                  absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>) {
LAB_002f2f4f:
      return (reference)CONCAT71((int7)((ulong)pDVar3 >> 8),pDVar3 == pDVar4);
    }
    if ((pDVar3 ==
        (Descriptor *)absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>) ==
        (pDVar4 ==
        (Descriptor *)absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>)) {
      if (pDVar3 == (Descriptor *)0x0 || pDVar4 == (Descriptor *)0x0) goto LAB_002f2f4f;
      if ((pDVar4 == (Descriptor *)&kSooControl) == (pDVar3 == (Descriptor *)&kSooControl)) {
        this = (iterator *)((Descriptor *)this)->all_names_;
        pDVar5 = in_RSI[1];
        if (pDVar3 == (Descriptor *)&kSooControl) {
          bVar32 = (Descriptor *)this == pDVar5;
        }
        else {
          pDVar33 = pDVar5;
          pDVar26 = pDVar4;
          pDVar27 = (Descriptor *)this;
          if (pDVar4 < pDVar3) {
            pDVar33 = (Descriptor *)this;
            pDVar26 = pDVar3;
            pDVar27 = pDVar5;
          }
          in_RSI = (Descriptor **)CONCAT71((int7)((ulong)pDVar26 >> 8),pDVar26 < pDVar27);
          bVar32 = pDVar27 <= pDVar33 && pDVar26 < pDVar27;
        }
        if (bVar32) goto LAB_002f2f4f;
      }
      goto LAB_002f2f66;
    }
  }
  else {
    container_internal::operator==();
LAB_002f2f5c:
    container_internal::operator==();
  }
  container_internal::operator==();
LAB_002f2f66:
  container_internal::operator==();
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,absl::lts_20240722::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>>>
  ::AssertHashEqConsistent<google::protobuf::Descriptor_const*>
            ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,absl::lts_20240722::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>>>
              *)this,in_RSI);
  lVar6._0_1_ = ((Descriptor *)this)->super_SymbolBase;
  lVar6._1_1_ = ((Descriptor *)this)->field_0x1;
  lVar6._2_2_ = ((Descriptor *)this)->sequential_field_limit_;
  lVar6._4_4_ = ((Descriptor *)this)->field_count_;
  if (lVar6 == 1) {
    if ((((Descriptor *)this)->all_names_ < (string *)0x2) ||
       (psVar30 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>_>_>
                  ::soo_slot((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>_>_>
                              *)this), (psVar30->value).first != *in_RSI)) {
      ppVar31 = (reference)0x0;
    }
    else {
      raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>_>_>
      ::soo_slot((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>_>_>
                  *)this);
      ppVar31 = (reference)&kSooControl;
    }
    return ppVar31;
  }
  if (lVar6 != 0) {
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>_>_>
    ::prefetch_heap_block
              ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>_>_>
                *)this);
    auVar38._8_8_ = 0;
    auVar38._0_8_ = (long)&hash_internal::MixingHashState::kSeed + (long)*in_RSI;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = &(*in_RSI)->super_SymbolBase +
                   (SUB168(auVar38 * ZEXT816(0x9ddfea08eb382d69),0) ^
                   SUB168(auVar38 * ZEXT816(0x9ddfea08eb382d69),8));
    uVar7 = *(ulong *)this;
    if (uVar7 == 1) {
      __assert_fail("!is_soo()",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xdb0,
                    "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::MessagePtr>, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, std::allocator<std::pair<const google::protobuf::Descriptor *const, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::MessagePtr>>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::MessagePtr>, Hash = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, Alloc = std::allocator<std::pair<const google::protobuf::Descriptor *const, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::MessagePtr>>, K = const google::protobuf::Descriptor *]"
                   );
    }
    if (uVar7 != 0) {
      if ((uVar7 + 1 & uVar7) != 0) {
        __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0x145,
                      "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]"
                     );
      }
      uVar37 = SUB168(auVar9 * ZEXT816(0x9ddfea08eb382d69),8) ^
               SUB168(auVar9 * ZEXT816(0x9ddfea08eb382d69),0);
      uStack_a0 = (uVar37 >> 7 ^ (ulong)((Descriptor *)this)->file_ >> 0xc) & uVar7;
      pcVar29 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>_>_>
                ::control((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>_>_>
                           *)this);
      uVar36 = (undefined1)uVar37;
      auVar38 = ZEXT216(CONCAT11(uVar36,uVar36) & 0x7f7f);
      auVar38 = pshuflw(auVar38,auVar38,0);
      uVar37 = 0;
      do {
        pcVar1 = pcVar29 + uStack_a0;
        cVar10 = *pcVar1;
        cVar11 = pcVar1[1];
        cVar12 = pcVar1[2];
        cVar13 = pcVar1[3];
        cVar14 = pcVar1[4];
        cVar15 = pcVar1[5];
        cVar16 = pcVar1[6];
        cVar17 = pcVar1[7];
        cVar18 = pcVar1[8];
        cVar19 = pcVar1[9];
        cVar20 = pcVar1[10];
        cVar21 = pcVar1[0xb];
        cVar22 = pcVar1[0xc];
        cVar23 = pcVar1[0xd];
        cVar24 = pcVar1[0xe];
        cVar25 = pcVar1[0xf];
        cStack_68 = auVar38[0];
        cStack_67 = auVar38[1];
        cStack_66 = auVar38[2];
        cStack_65 = auVar38[3];
        auVar39[0] = -(cStack_68 == cVar10);
        auVar39[1] = -(cStack_67 == cVar11);
        auVar39[2] = -(cStack_66 == cVar12);
        auVar39[3] = -(cStack_65 == cVar13);
        auVar39[4] = -(cStack_68 == cVar14);
        auVar39[5] = -(cStack_67 == cVar15);
        auVar39[6] = -(cStack_66 == cVar16);
        auVar39[7] = -(cStack_65 == cVar17);
        auVar39[8] = -(cStack_68 == cVar18);
        auVar39[9] = -(cStack_67 == cVar19);
        auVar39[10] = -(cStack_66 == cVar20);
        auVar39[0xb] = -(cStack_65 == cVar21);
        auVar39[0xc] = -(cStack_68 == cVar22);
        auVar39[0xd] = -(cStack_67 == cVar23);
        auVar39[0xe] = -(cStack_66 == cVar24);
        auVar39[0xf] = -(cStack_65 == cVar25);
        uVar28 = (ushort)(SUB161(auVar39 >> 7,0) & 1) | (ushort)(SUB161(auVar39 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar39 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar39 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar39 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar39 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar39 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar39 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar39 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar39 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar39 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar39 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar39 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar39 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar39 >> 0x77,0) & 1) << 0xe | (ushort)(auVar39[0xf] >> 7) << 0xf
        ;
        uVar35 = (uint)uVar28;
        while( true ) {
          iVar41.field_1 =
               (anon_union_8_1_a8a14541_for_iterator_2)
               (anon_union_8_1_a8a14541_for_iterator_2)aStack_70.slot_;
          iVar41.ctrl_ = (ctrl_t *)ppStack_80;
          if (uVar28 == 0) break;
          uVar8 = 0;
          if (uVar35 != 0) {
            for (; (uVar35 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
            }
          }
          psVar30 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>_>_>
                    ::slot_array((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>_>_>
                                  *)this);
          uVar34 = uVar8 + uStack_a0 & uVar7;
          if (psVar30[uVar34].value.first == *in_RSI) {
            iVar41 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>_>_>
                     ::iterator_at((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>_>_>
                                    *)this,uVar34);
            break;
          }
          uVar28 = (ushort)(uVar35 - 1) & (ushort)uVar35;
          uVar35 = CONCAT22((short)(uVar35 - 1 >> 0x10),uVar28);
        }
        aStack_70 = iVar41.field_1;
        ppStack_80 = (reference)iVar41.ctrl_;
        if (uVar28 != 0) {
          bVar32 = false;
        }
        else {
          auVar40[0] = -(cVar10 == kEmpty);
          auVar40[1] = -(cVar11 == kEmpty);
          auVar40[2] = -(cVar12 == kEmpty);
          auVar40[3] = -(cVar13 == kEmpty);
          auVar40[4] = -(cVar14 == kEmpty);
          auVar40[5] = -(cVar15 == kEmpty);
          auVar40[6] = -(cVar16 == kEmpty);
          auVar40[7] = -(cVar17 == kEmpty);
          auVar40[8] = -(cVar18 == kEmpty);
          auVar40[9] = -(cVar19 == kEmpty);
          auVar40[10] = -(cVar20 == kEmpty);
          auVar40[0xb] = -(cVar21 == kEmpty);
          auVar40[0xc] = -(cVar22 == kEmpty);
          auVar40[0xd] = -(cVar23 == kEmpty);
          auVar40[0xe] = -(cVar24 == kEmpty);
          auVar40[0xf] = -(cVar25 == kEmpty);
          if ((((((((((((((((auVar40 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                           (auVar40 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar40 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar40 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar40 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar40 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar40 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar40 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar40 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar40 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar40 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar40 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar40 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar40 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar40 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar40[0xf]) {
            uVar34._0_1_ = ((Descriptor *)this)->super_SymbolBase;
            uVar34._1_1_ = ((Descriptor *)this)->field_0x1;
            uVar34._2_2_ = ((Descriptor *)this)->sequential_field_limit_;
            uVar34._4_4_ = ((Descriptor *)this)->field_count_;
            if (uVar34 == 0) break;
            if (uVar34 < uVar37 + 0x10) {
              __assert_fail("seq.index() <= capacity() && \"full table!\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0xdbd,
                            "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::MessagePtr>, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, std::allocator<std::pair<const google::protobuf::Descriptor *const, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::MessagePtr>>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::MessagePtr>, Hash = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, Alloc = std::allocator<std::pair<const google::protobuf::Descriptor *const, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::MessagePtr>>, K = const google::protobuf::Descriptor *]"
                           );
            }
            uStack_a0 = uStack_a0 + uVar37 + 0x10 & uVar7;
            bVar32 = true;
            uVar37 = uVar37 + 0x10;
          }
          else {
            ppStack_80 = (reference)0x0;
            bVar32 = false;
          }
        }
        if (!bVar32) {
          return ppStack_80;
        }
      } while( true );
    }
  }
  __assert_fail("!kEnabled || cap >= kCapacity",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xb37,
                "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::MessagePtr>, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, std::allocator<std::pair<const google::protobuf::Descriptor *const, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::MessagePtr>>>::capacity() const [Policy = absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::MessagePtr>, Hash = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, Alloc = std::allocator<std::pair<const google::protobuf::Descriptor *const, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::MessagePtr>>]"
               );
}

Assistant:

reference operator*() const {
      AssertIsFull(ctrl_, generation(), generation_ptr(), "operator*()");
      return unchecked_deref();
    }